

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall
cmFindProgramCommand::InitialPass
          (cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *psVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string result;
  
  psVar1 = &(this->super_cmFindBase).VariableDocumentation;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName);
  iVar3 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand._vptr_cmCommand[7])
                    (this,argsIn);
  if (SUB41(iVar3,0) != false) {
    if ((this->super_cmFindBase).AlreadyInCache == true) {
      if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo == true) {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
                   &(this->super_cmFindBase).VariableName,"",
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
      }
    }
    else {
      FindProgram_abi_cxx11_(&result,this);
      bVar2 = std::operator!=(&result,"");
      this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      __lhs = &(this->super_cmFindBase).VariableName;
      if (bVar2) {
        cmMakefile::AddCacheDefinition
                  (this_00,__lhs,result._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,FILEPATH,false);
      }
      else {
        std::operator+(&local_60,__lhs,"-NOTFOUND");
        cmMakefile::AddCacheDefinition
                  (this_00,__lhs,local_60._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,FILEPATH,false
                  );
        std::__cxx11::string::~string((string *)&local_60);
      }
      std::__cxx11::string::~string((string *)&result);
    }
  }
  return SUB41(iVar3,0);
}

Assistant:

bool cmFindProgramCommand::InitialPass(std::vector<std::string> const& argsIn,
                                       cmExecutionStatus&)
{
  this->VariableDocumentation = "Path to a program.";
  this->CMakePathName = "PROGRAM";
  // call cmFindBase::ParseArguments
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  if (this->AlreadyInCache) {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->AlreadyInCacheWithoutMetaInfo) {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmStateEnums::FILEPATH);
    }
    return true;
  }

  std::string result = FindProgram();
  if (result != "") {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName, result.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmStateEnums::FILEPATH);

    return true;
  }
  this->Makefile->AddCacheDefinition(
    this->VariableName, (this->VariableName + "-NOTFOUND").c_str(),
    this->VariableDocumentation.c_str(), cmStateEnums::FILEPATH);
  return true;
}